

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsErrorCode
WScriptJsrt::InitializeImportMetaCallback(JsModuleRecord referencingModule,JsValueRef importMetaVar)

{
  JsErrorCode JVar1;
  JsPropertyIdRef local_28;
  JsPropertyIdRef urlPropId;
  JsValueRef specifier;
  JsValueRef importMetaVar_local;
  JsModuleRecord referencingModule_local;
  
  if (importMetaVar != (JsValueRef)0x0) {
    urlPropId = (JsPropertyIdRef)0x0;
    specifier = importMetaVar;
    importMetaVar_local = referencingModule;
    ChakraRTInterface::JsGetModuleHostInfo(referencingModule,JsModuleHostInfo_Url,&urlPropId);
    JVar1 = CreatePropertyIdFromString("url",&local_28);
    if (JVar1 == JsNoError) {
      ChakraRTInterface::JsSetProperty(specifier,local_28,urlPropId,false);
    }
  }
  return JsNoError;
}

Assistant:

JsErrorCode __stdcall WScriptJsrt::InitializeImportMetaCallback(_In_opt_ JsModuleRecord referencingModule, _In_opt_ JsValueRef importMetaVar)
{
    if (importMetaVar != nullptr)
    {
        JsValueRef specifier = JS_INVALID_REFERENCE;
        ChakraRTInterface::JsGetModuleHostInfo(referencingModule, JsModuleHostInfo_Url, &specifier);

        JsPropertyIdRef urlPropId;
        if (JsNoError == CreatePropertyIdFromString("url", &urlPropId))
        {
            ChakraRTInterface::JsSetProperty(importMetaVar, urlPropId, specifier, false);
        }
    }

    return JsNoError;
}